

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

bool ASDCP::MXF::GetEditRateFromFP(OP1aHeader *header,Rational *edit_rate)

{
  Rational RVar1;
  undefined8 *******pppppppuVar2;
  undefined8 *******pppppppuVar3;
  long *plVar4;
  char cVar5;
  Dictionary *pDVar6;
  MDDEntry *pMVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ILogSink *pIVar11;
  undefined8 uVar12;
  bool bVar13;
  char *pcVar14;
  InterchangeObject *temp_item;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> temp_items
  ;
  char buf [64];
  Result_t result;
  long *local_188;
  Rational *local_180;
  ulong local_178;
  undefined8 ******local_170;
  undefined8 ******local_168;
  long local_160;
  long local_158;
  long local_150;
  char local_148 [72];
  int local_100 [26];
  Result_t local_98 [104];
  
  local_170 = &local_170;
  local_160 = 0;
  local_168 = local_170;
  pDVar6 = DefaultCompositeDict();
  pMVar7 = Dictionary::Type(pDVar6,MDD_SourcePackage);
  (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x16])
            (local_100,header,pMVar7,&local_170);
  if (local_100[0] < 0) {
    pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
    bVar13 = false;
    Kumu::ILogSink::Error(pIVar11,"The MXF header does not contain a FilePackage item.\n");
  }
  else if (local_160 == 1) {
    local_180 = edit_rate;
    if (((undefined8 ******)local_170[2] == (undefined8 ******)0x0) ||
       (lVar8 = __dynamic_cast(local_170[2],&InterchangeObject::typeinfo,&SourcePackage::typeinfo,0)
       , lVar8 == 0)) {
      __assert_fail("source_package",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                    ,0x7e1,
                    "bool ASDCP::MXF::GetEditRateFromFP(ASDCP::MXF::OP1aHeader &, ASDCP::Rational &)"
                   );
    }
    lVar10 = *(long *)(lVar8 + 0x138);
    if (lVar10 != *(long *)(lVar8 + 0x140)) {
      local_178 = 0;
      local_158 = lVar8;
      do {
        (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x13])
                  (local_98,header,lVar10,&local_188);
        Kumu::Result_t::operator=((Result_t *)local_100,local_98);
        Kumu::Result_t::~Result_t(local_98);
        if (local_100[0] < 0) {
          pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
          uVar12 = Kumu::bin2UUIDhex((uchar *)(lVar10 + 9),0x10,local_148,0x40);
          bVar13 = false;
          Kumu::ILogSink::Error
                    (pIVar11,"The MXF header is incomplete: strong reference %s leads nowhere.\n",
                     uVar12);
          goto LAB_001ac7a4;
        }
        if ((local_188 == (long *)0x0) ||
           (lVar8 = __dynamic_cast(local_188,&InterchangeObject::typeinfo,&Track::typeinfo,0),
           lVar8 == 0)) {
          pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
          uVar12 = Kumu::bin2UUIDhex((uchar *)(lVar10 + 9),0x10,local_148,0x40);
          pcVar14 = "The MXF header is incomplete: %s is not a Track item.\n";
LAB_001ac8ad:
          bVar13 = false;
          Kumu::ILogSink::Error(pIVar11,pcVar14,uVar12);
          goto LAB_001ac7a4;
        }
        (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x13])
                  (local_98,header,lVar8 + 0xd8,&local_188);
        Kumu::Result_t::operator=((Result_t *)local_100,local_98);
        Kumu::Result_t::~Result_t(local_98);
        if (local_100[0] < 0) {
          pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
          uVar12 = Kumu::bin2UUIDhex((uchar *)(lVar10 + 9),0x10,local_148,0x40);
          pcVar14 = "The MXF header is incomplete: strong reference %s leads nowhere.\n";
          goto LAB_001ac8ad;
        }
        if ((local_188 == (long *)0x0) ||
           (lVar9 = __dynamic_cast(local_188,&InterchangeObject::typeinfo,&Sequence::typeinfo,0),
           lVar9 == 0)) {
          pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
          uVar12 = Kumu::bin2UUIDhex((uchar *)(lVar8 + 0xe1),0x10,local_148,0x40);
          pcVar14 = "The MXF header is incomplete: %s is not a Sequence item.\n";
          goto LAB_001ac97e;
        }
        if (*(long *)(lVar9 + 0xe0) - *(long *)(lVar9 + 0xd8) != 0x20) {
          pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
          bVar13 = false;
          Kumu::ILogSink::Error
                    (pIVar11,
                     "The Sequence item must contain one reference to an esence item, found %d.\n",
                     *(long *)(lVar9 + 0xe0) - *(long *)(lVar9 + 0xd8) >> 5);
          goto LAB_001ac7a4;
        }
        (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x13])
                  (local_98,header,*(long *)(lVar9 + 0xd8),&local_188);
        Kumu::Result_t::operator=((Result_t *)local_100,local_98);
        Kumu::Result_t::~Result_t(local_98);
        plVar4 = local_188;
        if (local_100[0] < 0) {
          pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
          uVar12 = Kumu::bin2UUIDhex((uchar *)(*(long *)(lVar9 + 0xd8) + 9),0x10,local_148,0x40);
          pcVar14 = "The MXF header is incomplete: strong reference %s leads nowhere.\n";
LAB_001ac97e:
          bVar13 = false;
          Kumu::ILogSink::Error(pIVar11,pcVar14,uVar12);
          goto LAB_001ac7a4;
        }
        local_150 = lVar10;
        pDVar6 = DefaultCompositeDict();
        pMVar7 = Dictionary::Type(pDVar6,MDD_SourceClip);
        cVar5 = (**(code **)(*plVar4 + 0x78))(plVar4,pMVar7);
        plVar4 = local_188;
        if (cVar5 == '\0') {
          pDVar6 = DefaultCompositeDict();
          pMVar7 = Dictionary::Type(pDVar6,MDD_TimecodeComponent);
          cVar5 = (**(code **)(*plVar4 + 0x78))(plVar4,pMVar7);
          if (cVar5 != '\0') goto LAB_001ac74d;
          pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
          uVar12 = (**(code **)(*local_188 + 0x80))();
          pcVar14 = "Reference from Sequence to an unexpected type: %s.\n";
          goto LAB_001ac97e;
        }
        if ((local_188 == (long *)0x0) ||
           (lVar10 = __dynamic_cast(local_188,&InterchangeObject::typeinfo,&SourceClip::typeinfo,0),
           lVar10 == 0)) {
          pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
          uVar12 = Kumu::bin2UUIDhex((uchar *)(*(long *)(lVar9 + 0xd8) + 9),0x10,local_148,0x40);
          pcVar14 = "The MXF header is incomplete: %s is not a SourceClip item.\n";
LAB_001ac94e:
          bVar13 = false;
          Kumu::ILogSink::Error(pIVar11,pcVar14,uVar12);
          goto LAB_001ac7a4;
        }
        if ((local_178 & 1) == 0) {
          RVar1 = *(Rational *)(lVar8 + 0x108);
          *local_180 = RVar1;
          local_178 = CONCAT71(RVar1._1_7_,1);
        }
        else if ((*(int *)(lVar8 + 0x108) != local_180->Numerator) ||
                (local_178 = CONCAT71((int7)((ulong)local_180 >> 8),1),
                *(int *)(lVar8 + 0x10c) != local_180->Denominator)) {
          pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
          uVar12 = Kumu::bin2UUIDhex((uchar *)(*(long *)(lVar9 + 0xd8) + 9),0x10,local_148,0x40);
          pcVar14 = 
          "The MXF header is incomplete: %s EditRate value does not match others in the file.\n";
          goto LAB_001ac94e;
        }
LAB_001ac74d:
        lVar10 = local_150 + 0x20;
      } while (lVar10 != *(long *)(local_158 + 0x140));
    }
    bVar13 = true;
  }
  else {
    pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
    bVar13 = false;
    Kumu::ILogSink::Error
              (pIVar11,"The MXF header must contain one FilePackage item, found %d.\n",local_160);
  }
LAB_001ac7a4:
  Kumu::Result_t::~Result_t((Result_t *)local_100);
  pppppppuVar3 = (undefined8 *******)local_170;
  while (pppppppuVar3 != &local_170) {
    pppppppuVar2 = (undefined8 *******)*pppppppuVar3;
    operator_delete(pppppppuVar3,0x18);
    pppppppuVar3 = pppppppuVar2;
  }
  return bVar13;
}

Assistant:

bool
ASDCP::MXF::GetEditRateFromFP(ASDCP::MXF::OP1aHeader& header, ASDCP::Rational& edit_rate)
{
  bool has_first_item = false;

  MXF::InterchangeObject* temp_item;
  std::list<MXF::InterchangeObject*> temp_items;

  Result_t result = header.GetMDObjectsByType(DefaultCompositeDict().ul(MDD_SourcePackage), temp_items);

  if ( KM_FAILURE(result) )
    {
      DefaultLogSink().Error("The MXF header does not contain a FilePackage item.\n");
      return false;
    }

  if ( temp_items.size() != 1 )
    {
      DefaultLogSink().Error("The MXF header must contain one FilePackage item, found %d.\n", temp_items.size());
      return false;
    }

  char buf[64];
  MXF::Array<UUID>::const_iterator i;
  MXF::SourcePackage *source_package = dynamic_cast<MXF::SourcePackage*>(temp_items.front());
  assert(source_package);

  for ( i = source_package->Tracks.begin(); i != source_package->Tracks.end(); ++i )
    {
      // Track
      result = header.GetMDObjectByID(*i, &temp_item);

      if ( KM_FAILURE(result) )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: strong reference %s leads nowhere.\n",
				 i->EncodeHex(buf, 64));
	  return false;
	}

      MXF::Track *track = dynamic_cast<MXF::Track*>(temp_item);

      if ( track == 0 )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: %s is not a Track item.\n",
				 i->EncodeHex(buf, 64));
	  return false;
	}

      // Sequence
      result = header.GetMDObjectByID(track->Sequence, &temp_item);

      if ( KM_FAILURE(result) )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: strong reference %s leads nowhere.\n",
				 i->EncodeHex(buf, 64));
	  return false;
	}

      MXF::Sequence *sequence = dynamic_cast<MXF::Sequence*>(temp_item);

      if ( sequence == 0 )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: %s is not a Sequence item.\n",
				 track->Sequence.get().EncodeHex(buf, 64));
	  return false;
	}

      if ( sequence->StructuralComponents.size() != 1 )
	{
	  DefaultLogSink().Error("The Sequence item must contain one reference to an esence item, found %d.\n",
				 sequence->StructuralComponents.size());
	  return false;
	}

      // SourceClip
      result = header.GetMDObjectByID(sequence->StructuralComponents.front(), &temp_item);

      if ( KM_FAILURE(result) )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: strong reference %s leads nowhere.\n",
				 sequence->StructuralComponents.front().EncodeHex(buf, 64));
	  return false;
	}

      if ( temp_item->IsA(DefaultCompositeDict().ul(MDD_SourceClip)) )
	{
	  MXF::SourceClip *source_clip = dynamic_cast<MXF::SourceClip*>(temp_item);

	  if ( source_clip == 0 )
	    {
	      DefaultLogSink().Error("The MXF header is incomplete: %s is not a SourceClip item.\n",
				     sequence->StructuralComponents.front().EncodeHex(buf, 64));
	      return false;
	    }

	  if ( ! has_first_item )
	    {
	      edit_rate = track->EditRate;
	      has_first_item = true;
	    }
	  else if ( edit_rate != track->EditRate )
	    {
	      DefaultLogSink().Error("The MXF header is incomplete: %s EditRate value does not match others in the file.\n",
				     sequence->StructuralComponents.front().EncodeHex(buf, 64));
	      return false;
	    }
	}
      else if ( ! temp_item->IsA(DefaultCompositeDict().ul(MDD_TimecodeComponent)) )
	{
	  DefaultLogSink().Error("Reference from Sequence to an unexpected type: %s.\n", temp_item->ObjectName());
	  return false;
	}
    }

  return true;
}